

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_dischargevars(FuncState *fs,expdesc *e)

{
  uint uVar1;
  int iVar2;
  Instruction i;
  
  switch(e->k) {
  case VLOCAL:
    e->k = VNONRELOC;
    return;
  case VUPVAL:
    i = (e->u).info << 0x17 | 5;
    break;
  case VINDEXED:
    uVar1 = (uint)(e->u).ind.idx;
    if (((uVar1 >> 8 & 1) == 0) && ((int)(uint)fs->nactvar <= (int)uVar1)) {
      fs->freereg = fs->freereg + 0xff;
    }
    uVar1 = 6;
    if (((e->u).ind.vt == '\b') && (uVar1 = 7, fs->nactvar <= (e->u).ind.t)) {
      fs->freereg = fs->freereg + 0xff;
    }
    i = (int)(e->u).ind.idx << 0xe | (uint)(e->u).ind.t << 0x17 | uVar1;
    break;
  default:
    goto switchD_001205e7_caseD_b;
  case VCALL:
  case VVARARG:
    luaK_setoneret(fs,e);
    return;
  }
  iVar2 = luaK_code(fs,i);
  (e->u).info = iVar2;
  e->k = VRELOCABLE;
switchD_001205e7_caseD_b:
  return;
}

Assistant:

void luaK_dischargevars(FuncState *fs, expdesc *e) {
    switch (e->k) {
        case VLOCAL: {  /* already in a register */
            e->k = VNONRELOC;  /* becomes a non-relocatable value */
            break;
        }
        case VUPVAL: {  /* move value to some (pending) register */
            e->u.info = luaK_codeABC(fs, OP_GETUPVAL, 0, e->u.info, 0);
            e->k = VRELOCABLE;
            break;
        }
        case VINDEXED: {
            OpCode op;
            freereg(fs, e->u.ind.idx);
            if (e->u.ind.vt == VLOCAL) {  /* is 't' in a register? */
                freereg(fs, e->u.ind.t);
                op = OP_GETTABLE;
            } else {
                lua_assert(e->u.ind.vt == VUPVAL);
                op = OP_GETTABUP;  /* 't' is in an upvalue */
            }
            e->u.info = luaK_codeABC(fs, op, 0, e->u.ind.t, e->u.ind.idx);
            e->k = VRELOCABLE;
            break;
        }
        case VVARARG:
        case VCALL: {
            luaK_setoneret(fs, e);
            break;
        }
        default:
            break;  /* there is one value available (somewhere) */
    }
}